

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

carray<long,_7UL> * frozen::knuth_morris_pratt_searcher<7UL>::build_kmp_cache(char (*needle) [8])

{
  char cVar1;
  size_t pos;
  long lVar2;
  long lVar3;
  carray<long,_7UL> *in_RDI;
  
  *(undefined4 *)(in_RDI->data_ + 4) = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 0x24) = 0xffffffff;
  *(undefined4 *)(in_RDI->data_ + 5) = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 0x2c) = 0xffffffff;
  *(undefined4 *)(in_RDI->data_ + 2) = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 0x14) = 0xffffffff;
  *(undefined4 *)(in_RDI->data_ + 3) = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 0x1c) = 0xffffffff;
  *(undefined4 *)in_RDI->data_ = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 4) = 0xffffffff;
  *(undefined4 *)(in_RDI->data_ + 1) = 0xffffffff;
  *(undefined4 *)((long)in_RDI->data_ + 0xc) = 0xffffffff;
  in_RDI->data_[6] = -1;
  lVar2 = 1;
  lVar3 = 0;
  do {
    cVar1 = (*needle)[lVar2];
    if (cVar1 == (*needle)[lVar3]) {
      in_RDI->data_[lVar2] = in_RDI->data_[lVar3];
    }
    else {
      in_RDI->data_[lVar2] = lVar3;
      do {
        lVar3 = in_RDI->data_[lVar3];
        if (lVar3 < 0) break;
      } while (cVar1 != (*needle)[lVar3]);
    }
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 1;
    if (lVar2 == 7) {
      return in_RDI;
    }
  } while( true );
}

Assistant:

static constexpr bits::carray<std::ptrdiff_t, size>
  build_kmp_cache(char const (&needle)[size + 1]) {
    std::ptrdiff_t cnd = 0;
    bits::carray<std::ptrdiff_t, size> cache(-1);
    for (std::size_t pos = 1; pos < size; ++pos) {
      if (needle[pos] == needle[cnd]) {
        cache[pos] = cache[cnd];
        cnd += 1;
      } else {
        cache[pos] = cnd;
        cnd = cache[cnd];
        while (cnd >= 0 && needle[pos] != needle[cnd])
          cnd = cache[cnd];
        cnd += 1;
      }
    }
    return cache;
  }